

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pHVar1;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  iterator iVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *ppVar6;
  undefined8 *puVar7;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  **ppsVar8;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar9;
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar10;
  pointer ppcVar11;
  char *in_R9;
  bool bVar12;
  byte bVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  r_10;
  TypeParam ht;
  AssertHelper local_3b8;
  AssertHelper local_3b0;
  undefined8 *local_3a8;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_3a0;
  undefined1 local_358 [16];
  undefined1 local_348 [40];
  iterator local_320;
  nonempty_iterator local_318;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_310 [9];
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_2c8;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_280;
  undefined8 local_278;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_270;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psStack_268;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_260;
  nonempty_iterator ppcStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_230;
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_228;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_1e0;
  undefined8 local_1d8;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_1d0;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psStack_1c8;
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_1c0;
  const_nonempty_iterator ppcStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_190;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_188;
  undefined8 *puStack_180;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  nonempty_iterator local_148;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_140;
  undefined1 local_130 [8];
  undefined1 local_128 [24];
  nonempty_iterator local_110;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_e8 [2];
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_d8 [2];
  iterator local_88;
  HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_40;
  
  bVar13 = 0;
  local_2c8.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_2c8.end.col_current = (nonempty_iterator)0x0;
  local_2c8.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_2c8.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_2c8.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_2c8.pos.col_current = (nonempty_iterator)0x0;
  local_2c8.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_2c8.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_280 = (HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_270 = (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  psStack_268 = (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0x0;
  local_260 = (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  ppcStack_258 = (nonempty_iterator)0x0;
  local_250 = 0;
  uStack_248 = 0;
  local_240 = 0;
  uStack_238 = 0;
  local_230 = (HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_1e0 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  local_228.end.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_228.end.col_current = (const_nonempty_iterator)0x0;
  local_228.end.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_228.end.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_228.pos.row_current._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_228.pos.col_current = (const_nonempty_iterator)0x0;
  local_228.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_228.pos.row_end._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_1d0 = (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  psStack_1c8 = (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0x0;
  local_1c0 = (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  ppcStack_1b8 = (const_nonempty_iterator)0x0;
  local_1b0 = 0;
  uStack_1a8 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  local_190 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  bVar12 = (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.table.settings.num_buckets ==
           (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.num_deleted;
  local_358[0] = (internal)bVar12;
  local_358._8_8_ =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar12) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)local_358,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ae,(char *)local_130);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if (local_130 != (undefined1  [8])(local_128 + 8)) {
      operator_delete((void *)local_130);
    }
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
    uVar3 = local_358._8_8_;
    if ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ !=
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((int **)*(pointer *)local_358._8_8_ !=
          &(((Settings *)(local_358._8_8_ + 8))->
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete(*(pointer *)local_358._8_8_);
      }
      operator_delete((void *)uVar3);
    }
  }
  pHVar1 = &(this->
            super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ).
            super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((iterator *)local_130,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3a0);
  local_358._8_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_348._0_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_348._16_8_ = (nonempty_iterator)0x0;
  local_318 = (nonempty_iterator)0x0;
  local_358._0_8_ = this_00;
  local_348._8_8_ = local_348._0_8_;
  local_348._24_8_ = local_358._8_8_;
  local_348._32_8_ = local_348._0_8_;
  local_320._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_;
  local_e8[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)pHVar1;
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_358);
  if (((local_128._0_8_ == local_358._8_8_) && (local_128._8_8_ == local_348._0_8_)) &&
     (local_128._16_8_ == local_348._8_8_)) {
    if (local_348._8_8_ != local_348._0_8_) {
      local_188._M_head_impl._0_1_ = local_110 == (nonempty_iterator)local_348._16_8_;
      puStack_180 = (undefined8 *)0x0;
      if (local_110 != (nonempty_iterator)local_348._16_8_) goto LAB_00855352;
    }
  }
  else {
    local_188._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_188._M_head_impl._1_7_ << 8);
LAB_00855352:
    puStack_180 = (undefined8 *)0x0;
    testing::Message::Message((Message *)local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)&local_188,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) == this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2af,(char *)local_130);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if (local_130 != (undefined1  [8])(local_128 + 8)) {
      operator_delete((void *)local_130);
    }
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_358._0_8_ + 8))();
    }
    puVar7 = puStack_180;
    if (puStack_180 != (undefined8 *)0x0) {
      if ((undefined8 *)*puStack_180 != puStack_180 + 2) {
        operator_delete((undefined8 *)*puStack_180);
      }
      operator_delete(puVar7);
    }
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_3a0.ht & 0xffffffff00000000);
  local_188._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       UniqueObjectHelper<char_const*>(1);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_188);
  local_358._1_7_ = 0;
  local_358[0] = (internal)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_130,"0u","this->ht_.count(this->UniqueKey(1))",(uint *)&local_3a0,
             (unsigned_long *)local_358);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if ((pointer)local_128._0_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_128._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b0,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_358._0_8_ + 8))();
    }
  }
  uVar3 = local_128._0_8_;
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_128._0_8_ !=
        &(((Settings *)(local_128._0_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_128._0_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_358._0_8_ = UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_130,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)this_00,(char **)local_358);
  ppVar6 = (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_130;
  psVar9 = &local_2c8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar9->ht = (ppVar6->first).ht;
    ppVar6 = (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)((long)ppVar6 + (ulong)bVar13 * -0x10 + 8);
    psVar9 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_e8;
  puVar7 = &local_278;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  local_280 = pHVar1;
  local_230 = pHVar1;
  if (((local_2c8.pos.row_begin._M_current == local_270) &&
      (local_2c8.pos.row_end._M_current == psStack_268)) &&
     (local_2c8.pos.row_current._M_current == local_260)) {
    if (local_2c8.pos.row_current._M_current != local_2c8.pos.row_end._M_current) {
      local_358[0] = (internal)(local_2c8.pos.col_current == ppcStack_258);
      local_358._8_8_ = (pointer)0x0;
      if (local_2c8.pos.col_current != ppcStack_258) goto LAB_008555a6;
    }
  }
  else {
    local_358._0_8_ = (ulong)(uint7)local_358._1_7_ << 8;
LAB_008555a6:
    local_358._8_8_ = (pointer)0x0;
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)local_358,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b2,(char *)local_130);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if (local_130 != (undefined1  [8])(local_128 + 8)) {
      operator_delete((void *)local_130);
    }
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
    uVar3 = local_358._8_8_;
    if ((pointer)local_358._8_8_ != (pointer)0x0) {
      if ((int **)*(pointer *)local_358._8_8_ !=
          &(((Settings *)(local_358._8_8_ + 8))->
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete(*(pointer *)local_358._8_8_);
      }
      operator_delete((void *)uVar3);
    }
  }
  local_358._0_8_ = UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  bVar12 = (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.table.settings.num_buckets !=
           (this->
           super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.num_deleted;
  local_358[0] = (internal)bVar12;
  local_358._8_8_ = (pointer)0x0;
  if (!bVar12) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_130,(internal *)local_358,(AssertionResult *)"this->ht_.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2b5,(char *)local_130);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if (local_130 != (undefined1  [8])(local_128 + 8)) {
      operator_delete((void *)local_130);
    }
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
    uVar3 = local_358._8_8_;
    if ((pointer)local_358._8_8_ != (pointer)0x0) {
      if ((int **)*(pointer *)local_358._8_8_ !=
          &(((Settings *)(local_358._8_8_ + 8))->
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete(*(pointer *)local_358._8_8_);
      }
      operator_delete((void *)uVar3);
    }
  }
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0xb);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0x6f);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0x457);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0x2b67);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0x1b207);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0x10f447);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0xa98ac7);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_358._0_8_ = UniqueObjectHelper<char_const*>(0x69f6bc7);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                     *)local_130,this_00,(const_reference)local_358);
  local_188._M_head_impl._0_4_ = 9;
  local_358._0_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.settings.num_buckets -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_130,"9u","this->ht_.size()",(uint *)&local_188,
             (unsigned_long *)local_358);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if ((pointer)local_128._0_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_128._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2be,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)local_358._0_8_ + 8))();
    }
  }
  uVar3 = local_128._0_8_;
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_128._0_8_ !=
        &(((Settings *)(local_128._0_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_128._0_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_130 = (undefined1  [8])UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>(&local_88,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)local_130);
  local_178 = local_88.pos.row_end._M_current._0_4_;
  uStack_174 = local_88.pos.row_end._M_current._4_4_;
  uStack_170 = local_88.pos.row_current._M_current._0_4_;
  uStack_16c = local_88.pos.row_current._M_current._4_4_;
  local_168 = local_88.pos.col_current._0_4_;
  uStack_164 = local_88.pos.col_current._4_4_;
  uStack_160 = local_88.end.row_begin._M_current._0_4_;
  uStack_15c = local_88.end.row_begin._M_current._4_4_;
  local_158 = local_88.end.row_end._M_current._0_4_;
  uStack_154 = local_88.end.row_end._M_current._4_4_;
  uStack_150 = local_88.end.row_current._M_current._0_4_;
  uStack_14c = local_88.end.row_current._M_current._4_4_;
  local_148 = local_88.end.col_current;
  local_140 = pHVar1;
  local_40 = pHVar1;
  local_358._0_4_ =
       (*(pHVar1->
         super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         )._vptr_BaseHashtableInterface[0xb])(pHVar1);
  local_358._4_4_ = extraout_var;
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(1);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_130,"it.key()","this->UniqueKey(1)",(char **)local_358,
             (char **)&local_3a0);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_358);
    if ((pointer)local_128._0_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_128._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c0,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_358._0_8_ + 8))();
    }
  }
  if ((pointer)local_128._0_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_128._0_8_ !=
        &(((Settings *)(local_128._0_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_128._0_8_);
    }
    operator_delete((void *)local_128._0_8_);
  }
  local_130 = (undefined1  [8])&PTR__BaseHashtableInterface_00c19198;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)local_128,this_00,0x20);
  local_130 = (undefined1  [8])&PTR__BaseHashtableInterface_00c19118;
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = this_00;
  local_3a0.pos.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_begin._M_current = local_3a0.pos.row_begin._M_current;
  local_3a0.end.row_end._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current == local_3a0.pos.row_end._M_current) {
      local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
    }
    else {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_00855cd0;
    }
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(1)) != this->ht_.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c6,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
LAB_00855cd0:
  local_3b8.data_._0_4_ = 1;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(1);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"1u","this->ht_.count(this->UniqueKey(1))",(uint *)&local_3b8,
             (unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c7,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)this_00,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar9 = &local_2c8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar9->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar9 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_278;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  local_280 = pHVar1;
  local_230 = pHVar1;
  if (((local_2c8.pos.row_begin._M_current == local_270) &&
      (local_2c8.pos.row_end._M_current == psStack_268)) &&
     (local_2c8.pos.row_current._M_current == local_260)) {
    if (local_2c8.pos.row_current._M_current == local_2c8.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)((ulong)local_3a0.ht._1_7_ << 8);
    }
    else {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_2c8.pos.col_current != ppcStack_258);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_2c8.pos.col_current != ppcStack_258) goto LAB_00855e39;
    }
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2c9,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
LAB_00855e39:
  iVar4 = (*(local_280->
            super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[10])();
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(extraout_var_00,iVar4);
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(1);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_358,"eq_pair.first.key()","this->UniqueKey(1)",(char **)&local_3a0,
             (char **)&local_3b0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ca,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&local_2c8);
  if (((local_2c8.pos.row_begin._M_current == local_270) &&
      (local_2c8.pos.row_end._M_current == psStack_268)) &&
     (local_2c8.pos.row_current._M_current == local_260)) {
    if (local_2c8.pos.row_current._M_current != local_2c8.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_2c8.pos.col_current == ppcStack_258);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_2c8.pos.col_current != ppcStack_258) goto LAB_00855f64;
    }
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
LAB_00855f64:
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cc,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((const_iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_130;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current == local_3a0.pos.row_end._M_current) {
      local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
    }
    else {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_00856180;
    }
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"ht.find(this->UniqueKey(1)) != ht.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ce,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
LAB_00856180:
  local_3b8.data_._0_4_ = 1;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(1);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"1u","ht.count(this->UniqueKey(1))",(uint *)&local_3b8,
             (unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2cf,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(1);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)local_128,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar10 = &local_228;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar10->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar10 = (sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar10 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_1d8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  local_1e0 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)local_130;
  local_190 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)local_130;
  if (((local_228.pos.row_begin._M_current == local_1d0) &&
      (local_228.pos.row_end._M_current == psStack_1c8)) &&
     (local_228.pos.row_current._M_current == local_1c0)) {
    if (local_228.pos.row_current._M_current == local_228.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)((ulong)local_3a0.ht._1_7_ << 8);
    }
    else {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_228.pos.col_current != ppcStack_1b8);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_228.pos.col_current != ppcStack_1b8) goto LAB_008562e6;
    }
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d1,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((undefined1 *)local_358._0_8_ != local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
LAB_008562e6:
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(**(code **)(*(long *)&(local_1e0->settings).
                                           super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
                                           .super_Hasher + 0x58))();
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(1);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_358,"const_eq_pair.first.key()","this->UniqueKey(1)",
             (char **)&local_3a0,(char **)&local_3b0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d2,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&local_228);
  if (((local_228.pos.row_begin._M_current == local_1d0) &&
      (local_228.pos.row_end._M_current == psStack_1c8)) &&
     (local_228.pos.row_current._M_current == local_1c0)) {
    if (local_228.pos.row_current._M_current != local_228.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_228.pos.col_current == ppcStack_1b8);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_228.pos.col_current != ppcStack_1b8) goto LAB_00856411;
    }
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
LAB_00856411:
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d4,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((undefined1 *)local_358._0_8_ != local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b67);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = this_00;
  local_3a0.pos.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_begin._M_current = local_3a0.pos.row_begin._M_current;
  local_3a0.end.row_end._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current == local_3a0.pos.row_end._M_current) {
      local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
    }
    else {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_00856628;
    }
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11111)) != this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d6,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
LAB_00856628:
  local_3b8.data_._0_4_ = 1;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b67);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"1u","this->ht_.count(this->UniqueKey(11111))",(uint *)&local_3b8
             ,(unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d7,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x2b67);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)this_00,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar9 = &local_2c8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar9->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar9 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_278;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  local_280 = pHVar1;
  local_230 = pHVar1;
  if (((local_2c8.pos.row_begin._M_current == local_270) &&
      (local_2c8.pos.row_end._M_current == psStack_268)) &&
     (local_2c8.pos.row_current._M_current == local_260)) {
    if (local_2c8.pos.row_current._M_current == local_2c8.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)((ulong)local_3a0.ht._1_7_ << 8);
    }
    else {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_2c8.pos.col_current != ppcStack_258);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_2c8.pos.col_current != ppcStack_258) goto LAB_00856791;
    }
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"eq_pair.first != eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2d9,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
LAB_00856791:
  iVar4 = (*(local_280->
            super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            )._vptr_BaseHashtableInterface[10])();
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(extraout_var_01,iVar4);
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b67);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_358,"eq_pair.first.key()","this->UniqueKey(11111)",
             (char **)&local_3a0,(char **)&local_3b0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2da,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&local_2c8);
  if (((local_2c8.pos.row_begin._M_current == local_270) &&
      (local_2c8.pos.row_end._M_current == psStack_268)) &&
     (local_2c8.pos.row_current._M_current == local_260)) {
    if (local_2c8.pos.row_current._M_current != local_2c8.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_2c8.pos.col_current == ppcStack_258);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_2c8.pos.col_current != ppcStack_258) goto LAB_008568bc;
    }
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
LAB_008568bc:
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2dc,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b67);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((const_iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_130;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current == local_3a0.pos.row_end._M_current) {
      local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
    }
    else {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_00856ad8;
    }
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"ht.find(this->UniqueKey(11111)) != ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2de,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
LAB_00856ad8:
  local_3b8.data_._0_4_ = 1;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b67);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"1u","ht.count(this->UniqueKey(11111))",(uint *)&local_3b8,
             (unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2df,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x2b67);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)local_128,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar10 = &local_228;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar10->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar10 = (sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar10 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_1d8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  local_1e0 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)local_130;
  local_190 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)local_130;
  if (((local_228.pos.row_begin._M_current == local_1d0) &&
      (local_228.pos.row_end._M_current == psStack_1c8)) &&
     (local_228.pos.row_current._M_current == local_1c0)) {
    if (local_228.pos.row_current._M_current == local_228.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)((ulong)local_3a0.ht._1_7_ << 8);
    }
    else {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_228.pos.col_current != ppcStack_1b8);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_228.pos.col_current != ppcStack_1b8) goto LAB_00856c41;
    }
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"const_eq_pair.first != const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e1,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((undefined1 *)local_358._0_8_ != local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
LAB_00856c41:
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(**(code **)(*(long *)&(local_1e0->settings).
                                           super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
                                           .super_Hasher + 0x58))();
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b67);
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)local_358,"const_eq_pair.first.key()","this->UniqueKey(11111)",
             (char **)&local_3a0,(char **)&local_3b0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e2,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&local_228);
  if (((local_228.pos.row_begin._M_current == local_1d0) &&
      (local_228.pos.row_end._M_current == psStack_1c8)) &&
     (local_228.pos.row_current._M_current == local_1c0)) {
    if (local_228.pos.row_current._M_current != local_228.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_228.pos.col_current == ppcStack_1b8);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_228.pos.col_current != ppcStack_1b8) goto LAB_00856d6c;
    }
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
LAB_00856d6c:
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e4,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((undefined1 *)local_358._0_8_ != local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b68);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = this_00;
  local_3a0.pos.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_begin._M_current = local_3a0.pos.row_begin._M_current;
  local_3a0.end.row_end._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current != local_3a0.pos.row_end._M_current) {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ == local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_00856ed1;
    }
  }
  else {
    local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
LAB_00856ed1:
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11112)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e7,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
  local_3b8.data_ = local_3b8.data_ & 0xffffffff00000000;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b68);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"0u","this->ht_.count(this->UniqueKey(11112))",(uint *)&local_3b8
             ,(unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2e8,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x2b68);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)this_00,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar9 = &local_2c8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar9->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar9 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_278;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  if (((local_2c8.pos.row_begin._M_current == local_270) &&
      (local_2c8.pos.row_end._M_current == psStack_268)) &&
     (local_2c8.pos.row_current._M_current == local_260)) {
    local_280 = pHVar1;
    local_230 = pHVar1;
    if (local_2c8.pos.row_current._M_current != local_2c8.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_2c8.pos.col_current == ppcStack_258);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_2c8.pos.col_current != ppcStack_258) goto LAB_008570f1;
    }
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
LAB_008570f1:
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    local_280 = pHVar1;
    local_230 = pHVar1;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ea,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b68);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((const_iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_130;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current != local_3a0.pos.row_end._M_current) {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ == local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_0085725b;
    }
  }
  else {
    local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
LAB_0085725b:
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"ht.find(this->UniqueKey(11112)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ec,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
  local_3b8.data_ = local_3b8.data_ & 0xffffffff00000000;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b68);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"0u","ht.count(this->UniqueKey(11112))",(uint *)&local_3b8,
             (unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ed,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x2b68);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)local_128,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar10 = &local_228;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar10->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar10 = (sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar10 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_1d8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  if (((local_228.pos.row_begin._M_current == local_1d0) &&
      (local_228.pos.row_end._M_current == psStack_1c8)) &&
     (local_228.pos.row_current._M_current == local_1c0)) {
    local_1e0 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)local_130;
    local_190 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)local_130;
    if (local_228.pos.row_current._M_current != local_228.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_228.pos.col_current == ppcStack_1b8);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_228.pos.col_current != ppcStack_1b8) goto LAB_0085747b;
    }
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
LAB_0085747b:
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    local_1e0 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)local_130;
    local_190 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)local_130;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2ef,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((undefined1 *)local_358._0_8_ != local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b66);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.table.groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = this_00;
  local_3a0.pos.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_begin._M_current = local_3a0.pos.row_begin._M_current;
  local_3a0.end.row_end._M_current = local_3a0.pos.row_end._M_current;
  local_3a0.end.row_current._M_current = local_3a0.pos.row_end._M_current;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)pHVar1;
  google::
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current != local_3a0.pos.row_end._M_current) {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ == local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_008575e0;
    }
  }
  else {
    local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
LAB_008575e0:
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"this->ht_.find(this->UniqueKey(11110)) == this->ht_.end()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f1,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
  local_3b8.data_ = local_3b8.data_ & 0xffffffff00000000;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b66);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this_00,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"0u","this->ht_.count(this->UniqueKey(11110))",(uint *)&local_3b8
             ,(unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f2,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x2b66);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)this_00,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar9 = &local_2c8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar9->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar9 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_278;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  if (((local_2c8.pos.row_begin._M_current == local_270) &&
      (local_2c8.pos.row_end._M_current == psStack_268)) &&
     (local_2c8.pos.row_current._M_current == local_260)) {
    local_280 = pHVar1;
    local_230 = pHVar1;
    if (local_2c8.pos.row_current._M_current != local_2c8.pos.row_end._M_current) {
      local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)CONCAT71(local_3a0.ht._1_7_,local_2c8.pos.col_current == ppcStack_258);
      local_3a0.pos.row_begin._M_current = (pointer)0x0;
      if (local_2c8.pos.col_current != ppcStack_258) goto LAB_008577fc;
    }
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
LAB_008577fc:
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    local_280 = pHVar1;
    local_230 = pHVar1;
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3a0,
               (AssertionResult *)"eq_pair.first == eq_pair.second","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f4,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
    iVar2._M_current = local_3a0.pos.row_begin._M_current;
    if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
      if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
          &((local_3a0.pos.row_begin._M_current)->settings).
           super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
           super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
        operator_delete((local_3a0.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_3b8.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b66);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>((const_iterator *)local_358,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b8);
  local_3a0.pos.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.pos.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.pos.col_current = (nonempty_iterator)0x0;
  local_3a0.end.row_begin._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a0.end.row_end._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.row_current._M_current =
       local_d8[0].
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3a0.end.col_current = (nonempty_iterator)0x0;
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_128;
  local_310[0] = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)local_130;
  google::
  sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted
            ((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&local_3a0);
  if ((((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._8_8_ == local_3a0.pos.row_begin._M_current) &&
      ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_348._0_8_ == local_3a0.pos.row_end._M_current)) &&
     ((sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)local_348._8_8_ == local_3a0.pos.row_current._M_current)) {
    if (local_3a0.pos.row_current._M_current != local_3a0.pos.row_end._M_current) {
      local_3b0.data_._0_1_ = (nonempty_iterator)local_348._16_8_ == local_3a0.pos.col_current;
      local_3a8 = (undefined8 *)0x0;
      if ((nonempty_iterator)local_348._16_8_ != local_3a0.pos.col_current) goto LAB_00857964;
    }
  }
  else {
    local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._1_7_ << 8);
LAB_00857964:
    local_3a8 = (undefined8 *)0x0;
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_358,(internal *)&local_3b0,
               (AssertionResult *)"ht.find(this->UniqueKey(11110)) == ht.end()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f6,(char *)local_358._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    if ((sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_358._0_8_ !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_348) {
      operator_delete((void *)local_358._0_8_);
    }
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
    puVar7 = local_3a8;
    if (local_3a8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3a8 != local_3a8 + 2) {
        operator_delete((undefined8 *)*local_3a8);
      }
      operator_delete(puVar7);
    }
  }
  local_3b8.data_ = local_3b8.data_ & 0xffffffff00000000;
  local_3b0.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(0x2b66);
  pVar14 = google::
           sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           ::find_position<char_const*>
                     ((sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)local_128,(char **)&local_3b0);
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)(ulong)(pVar14.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_358,"0u","ht.count(this->UniqueKey(11110))",(uint *)&local_3b8,
             (unsigned_long *)&local_3a0);
  if (local_358[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3a0);
    if ((pointer)local_358._8_8_ == (pointer)0x0) {
      ppcVar11 = (pointer)0xaf1463;
    }
    else {
      ppcVar11 = *(pointer *)local_358._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2f7,(char *)ppcVar11);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3a0.ht !=
        (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_3a0.ht)->settings).
                             super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
                             super_Hasher + 8))();
    }
  }
  uVar3 = local_358._8_8_;
  if ((pointer)local_358._8_8_ != (pointer)0x0) {
    if ((int **)*(pointer *)local_358._8_8_ !=
        &(((Settings *)(local_358._8_8_ + 8))->
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>).
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete(*(pointer *)local_358._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                  *)UniqueObjectHelper<char_const*>(0x2b66);
  google::
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::equal_range<char_const*>
            ((pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_358,
             (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)local_128,(char **)&local_3a0);
  puVar7 = (undefined8 *)local_358;
  psVar10 = &local_228;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    psVar10->ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                   *)*puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    psVar10 = (sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)((long)psVar10 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  ppsVar8 = local_310;
  puVar7 = &local_1d8;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *ppsVar8;
    ppsVar8 = ppsVar8 + (ulong)bVar13 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
  }
  if (((local_228.pos.row_begin._M_current == local_1d0) &&
      (local_228.pos.row_end._M_current == psStack_1c8)) &&
     (local_228.pos.row_current._M_current == local_1c0)) {
    local_1e0 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)local_130;
    local_190 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)local_130;
    if (local_228.pos.row_current._M_current == local_228.pos.row_end._M_current) goto LAB_00857c27;
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)CONCAT71(local_3a0.ht._1_7_,local_228.pos.col_current == ppcStack_1b8);
    local_3a0.pos.row_begin._M_current = (pointer)0x0;
    if (local_228.pos.col_current == ppcStack_1b8) goto LAB_00857c27;
  }
  else {
    local_3a0.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                    *)((ulong)local_3a0.ht._1_7_ << 8);
  }
  local_3a0.pos.row_begin._M_current = (pointer)0x0;
  local_1e0 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)local_130;
  local_190 = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               *)local_130;
  testing::Message::Message((Message *)&local_3b0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_358,(internal *)&local_3a0,
             (AssertionResult *)"const_eq_pair.first == const_eq_pair.second","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_3b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x2f9,(char *)local_358._0_8_);
  testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3b0);
  testing::internal::AssertHelper::~AssertHelper(&local_3b8);
  if ((undefined1 *)local_358._0_8_ != local_348) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_3b0.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_3b0.data_ + 8))();
  }
  iVar2._M_current = local_3a0.pos.row_begin._M_current;
  if (local_3a0.pos.row_begin._M_current != (pointer)0x0) {
    if ((int **)(local_3a0.pos.row_begin._M_current)->group !=
        &((local_3a0.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_3a0.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar2._M_current);
  }
LAB_00857c27:
  local_130 = (undefined1  [8])&PTR__BaseHashtableInterface_00c19198;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(local_d8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}